

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void nes_set_chip_option_nsfplay(void *chip,UINT32 NesOptions)

{
  uint uVar1;
  
  NES_APU_np_SetOption(*(void **)((long)chip + 8),0,NesOptions & 1);
  NES_DMC_np_SetOption(*(void **)((long)chip + 0x10),0,NesOptions & 1);
  uVar1 = NesOptions >> 1 & 1;
  NES_APU_np_SetOption(*(void **)((long)chip + 8),1,uVar1);
  NES_DMC_np_SetOption(*(void **)((long)chip + 0x10),1,uVar1);
  uVar1 = 2;
  do {
    NES_APU_np_SetOption
              (*(void **)((long)chip + 8),uVar1,(uint)((NesOptions >> (uVar1 & 0x1f) & 1) != 0));
    uVar1 = uVar1 + 1;
  } while (uVar1 != 4);
  uVar1 = 4;
  do {
    NES_DMC_np_SetOption
              (*(void **)((long)chip + 0x10),uVar1 - 2,
               (uint)((NesOptions >> (uVar1 & 0x1f) & 1) != 0));
    uVar1 = uVar1 + 1;
  } while (uVar1 != 10);
  if (*(long *)((long)chip + 0x18) != 0) {
    nes_set_chip_option_fds((NESAPU_INF *)chip,NesOptions);
    return;
  }
  return;
}

Assistant:

static void nes_set_chip_option_nsfplay(void* chip, UINT32 NesOptions)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT8 CurOpt;
	
	// shared APU/DMC options
	for (CurOpt = 0; CurOpt < 2; CurOpt ++)
	{
		NES_APU_np_SetOption(info->chip_apu, CurOpt, (NesOptions >> CurOpt) & 0x01);
		NES_DMC_np_SetOption(info->chip_dmc, CurOpt, (NesOptions >> CurOpt) & 0x01);
	}
	// APU-only options
	for (; CurOpt < 4; CurOpt ++)
		NES_APU_np_SetOption(info->chip_apu, CurOpt-2+2, (NesOptions >> CurOpt) & 0x01);
	// DMC-only options
	for (; CurOpt < 10; CurOpt ++)
		NES_DMC_np_SetOption(info->chip_dmc, CurOpt-4+2, (NesOptions >> CurOpt) & 0x01);
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_set_chip_option_fds(info, NesOptions);
#endif
	
	return;
}